

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

void __thiscall cppcms::widgets::base_widget::render(base_widget *this,form_context *context)

{
  uint uVar1;
  pointer pcVar2;
  ostream *out;
  ostream *out_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long lVar4;
  char *pcVar5;
  _Alloc_hider _Var6;
  undefined1 local_118 [32];
  escape local_f8;
  basic_message<char> local_d0;
  streamable local_50;
  
  auto_generate(this,context);
  out = form_context::out(context);
  uVar1 = context->html_list_type_;
  switch(uVar1) {
  case 0:
    pcVar5 = "<p>";
    lVar4 = 3;
    goto LAB_001f46fa;
  case 1:
    std::__ostream_insert<char,std::char_traits<char>>(out,"<tr><th>",8);
    if ((this->field_0x1f0 & 0x20) != 0) goto LAB_001f4717;
    goto LAB_001f491e;
  case 2:
    pcVar5 = "<li>";
    break;
  case 3:
    pcVar5 = "<dt>";
    break;
  default:
    goto switchD_001f46d5_default;
  }
  lVar4 = 4;
LAB_001f46fa:
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar5,lVar4);
switchD_001f46d5_default:
  if ((this->field_0x1f0 & 0x20) != 0) {
LAB_001f4717:
    if ((this->id_)._M_string_length == 0) {
      booster::locale::basic_message<char>::basic_message(&local_d0,&this->message_);
      filters::streamable::set
                ((streamable *)local_118,&local_d0,
                 filters::streamable::to_stream<booster::locale::basic_message<char>>,
                 filters::streamable::to_string<booster::locale::basic_message<char>>,
                 (type_info *)&booster::locale::basic_message<char>::typeinfo);
      filters::escape::escape(&local_f8,(streamable *)local_118);
      filters::escape::operator()(&local_f8,out);
      filters::escape::~escape(&local_f8);
      filters::streamable::~streamable((streamable *)local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0.plural_._M_dataplus._M_p != &local_d0.plural_.field_2) {
        operator_delete(local_d0.plural_._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0.context_._M_dataplus._M_p != &local_d0.context_.field_2) {
        operator_delete(local_d0.context_._M_dataplus._M_p);
      }
      paVar3 = &local_d0.id_.field_2;
      _Var6._M_p = local_d0.id_._M_dataplus._M_p;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(out,"<label for=\"",0xc);
      local_118._0_8_ = local_118 + 0x10;
      pcVar2 = (this->id_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_118,pcVar2,pcVar2 + (this->id_)._M_string_length);
      out_00 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,(char *)local_118._0_8_,local_118._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(out_00,"\">",2);
      booster::locale::basic_message<char>::basic_message(&local_d0,&this->message_);
      filters::streamable::set
                (&local_50,&local_d0,
                 filters::streamable::to_stream<booster::locale::basic_message<char>>,
                 filters::streamable::to_string<booster::locale::basic_message<char>>,
                 (type_info *)&booster::locale::basic_message<char>::typeinfo);
      filters::escape::escape(&local_f8,&local_50);
      filters::escape::operator()(&local_f8,out_00);
      std::__ostream_insert<char,std::char_traits<char>>(out_00,"</label>",8);
      filters::escape::~escape(&local_f8);
      filters::streamable::~streamable(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0.plural_._M_dataplus._M_p != &local_d0.plural_.field_2) {
        operator_delete(local_d0.plural_._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0.context_._M_dataplus._M_p != &local_d0.context_.field_2) {
        operator_delete(local_d0.context_._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0.id_._M_dataplus._M_p != &local_d0.id_.field_2) {
        operator_delete(local_d0.id_._M_dataplus._M_p);
      }
      paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_118 + 0x10);
      _Var6._M_p = (pointer)local_118._0_8_;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var6._M_p != paVar3) {
      operator_delete(_Var6._M_p);
    }
    if ((uVar1 & 0xfffffffd) != 1) {
LAB_001f491e:
      std::__ostream_insert<char,std::char_traits<char>>(out,"&nbsp;",6);
    }
  }
  if (context->html_list_type_ == 1) {
    pcVar5 = "</th><td>";
LAB_001f4950:
    std::__ostream_insert<char,std::char_traits<char>>(out,pcVar5,9);
  }
  else if (context->html_list_type_ == 3) {
    pcVar5 = "</dt><dd>";
    goto LAB_001f4950;
  }
  if ((this->field_0x1f0 & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (out,"<span class=\"cppcms_form_error\">",0x20);
    if ((this->field_0x1f0 & 0x40) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>(out,"*",1);
    }
    else {
      booster::locale::basic_message<char>::basic_message(&local_d0,&this->error_message_);
      filters::streamable::set
                ((streamable *)local_118,&local_d0,
                 filters::streamable::to_stream<booster::locale::basic_message<char>>,
                 filters::streamable::to_string<booster::locale::basic_message<char>>,
                 (type_info *)&booster::locale::basic_message<char>::typeinfo);
      filters::escape::escape(&local_f8,(streamable *)local_118);
      filters::escape::operator()(&local_f8,out);
      filters::escape::~escape(&local_f8);
      filters::streamable::~streamable((streamable *)local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0.plural_._M_dataplus._M_p != &local_d0.plural_.field_2) {
        operator_delete(local_d0.plural_._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0.context_._M_dataplus._M_p != &local_d0.context_.field_2) {
        operator_delete(local_d0.context_._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0.id_._M_dataplus._M_p != &local_d0.id_.field_2) {
        operator_delete(local_d0.id_._M_dataplus._M_p);
      }
    }
    pcVar5 = "</span> ";
    lVar4 = 8;
LAB_001f4a5c:
    std::__ostream_insert<char,std::char_traits<char>>(out,pcVar5,lVar4);
  }
  else if (uVar1 == 1) {
    pcVar5 = "&nbsp;";
    lVar4 = 6;
    goto LAB_001f4a5c;
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"<span class=\"cppcms_form_input\">",0x20);
  context->widget_part_type_ = 0;
  (*(this->super_base_form)._vptr_base_form[8])(this,context);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,(this->attr_)._M_dataplus._M_p,(this->attr_)._M_string_length);
  context->widget_part_type_ = 1;
  (*(this->super_base_form)._vptr_base_form[8])(this,context);
  std::__ostream_insert<char,std::char_traits<char>>(out,"</span>",7);
  if ((this->field_0x1f0 & 0x80) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<span class=\"cppcms_form_help\">",0x1f)
    ;
    booster::locale::basic_message<char>::basic_message(&local_d0,&this->help_);
    filters::streamable::set
              ((streamable *)local_118,&local_d0,
               filters::streamable::to_stream<booster::locale::basic_message<char>>,
               filters::streamable::to_string<booster::locale::basic_message<char>>,
               (type_info *)&booster::locale::basic_message<char>::typeinfo);
    filters::escape::escape(&local_f8,(streamable *)local_118);
    filters::escape::operator()(&local_f8,out);
    std::__ostream_insert<char,std::char_traits<char>>(out,"</span>",7);
    filters::escape::~escape(&local_f8);
    filters::streamable::~streamable((streamable *)local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.plural_._M_dataplus._M_p != &local_d0.plural_.field_2) {
      operator_delete(local_d0.plural_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.context_._M_dataplus._M_p != &local_d0.context_.field_2) {
      operator_delete(local_d0.context_._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0.id_._M_dataplus._M_p != &local_d0.id_.field_2) {
      operator_delete(local_d0.id_._M_dataplus._M_p);
    }
  }
  switch(context->html_list_type_) {
  case 0:
    pcVar5 = "</p>\n";
    lVar4 = 5;
    break;
  case 1:
    pcVar5 = "</td></tr>\n";
    lVar4 = 0xb;
    break;
  case 2:
    pcVar5 = "</li>\n";
    goto LAB_001f4be8;
  case 3:
    pcVar5 = "</dd>\n";
LAB_001f4be8:
    lVar4 = 6;
    break;
  case 4:
    pcVar5 = "\n";
    lVar4 = 1;
    break;
  default:
    goto switchD_001f4bba_default;
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar5,lVar4);
switchD_001f4bba_default:
  return;
}

Assistant:

void base_widget::render(form_context &context)
{
	auto_generate(&context);
	std::ostream &output = context.out();
	html_list_type type = context.html_list();
	switch(type) {
	case as_p: output<<"<p>"; break;
	case as_table: output<<"<tr><th>"; break;
	case as_ul: output<<"<li>"; break;
	case as_dl: output<<"<dt>"; break;
	default: ;
	}
	
	if(has_message()) {
		if(id_.empty())
			output << filters::escape(message());
		else
			output<<"<label for=\"" << id() << "\">" << filters::escape(message()) <<"</label>";
		if(type!=as_table && type!=as_dl)
			output << "&nbsp;";
	}
	else if(type == as_table) {
		output<<"&nbsp;";
	}
	switch(context.html_list()) {
	case as_table: output<<"</th><td>"; break;
	case as_dl: output<<"</dt><dd>"; break;
	default: ;
	}

	if(!valid()) {
		output<<"<span class=\"cppcms_form_error\">";
		if(has_error_message())
			output<<filters::escape(error_message());
		else
			output<<"*";
		output<<"</span> ";
	}
	else if(type == as_table){
		output<<"&nbsp;";
	}
	output<<"<span class=\"cppcms_form_input\">";
	context.widget_part(first_part);
	render_input(context);
	output<<attr_;
	context.widget_part(second_part);
	render_input(context);
	output<<"</span>";

	if(has_help()) {
		output<<"<span class=\"cppcms_form_help\">"<<filters::escape(help())<<"</span>";
	}
		
	switch(context.html_list()) {
	case as_p: output<<"</p>\n"; break;
	case as_table: output<<"</td></tr>\n"; break;
	case as_ul: output<<"</li>\n"; break;
	case as_dl: output<<"</dd>\n"; break;
	case as_space: output<<"\n";
	default: ;
	}
}